

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O1

void __thiscall QCollator::QCollator(QCollator *this)

{
  QCollatorPrivate *this_00;
  EVP_PKEY_CTX *ctx;
  long in_FS_OFFSET;
  QLocale QStack_38;
  QLocale local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QCollatorPrivate *)operator_new(0x20);
  QLocale::QLocale(&QStack_38);
  QLocale::collation(&local_30);
  (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  ctx = (EVP_PKEY_CTX *)&local_30;
  QLocale::QLocale(&this_00->locale,&local_30);
  this_00->caseSensitivity = CaseSensitive;
  this_00->numericMode = false;
  this_00->ignorePunctuation = false;
  this_00->dirty = true;
  this_00->collator = (CollatorType)0x0;
  QLocale::~QLocale(&local_30);
  QLocale::~QLocale(&QStack_38);
  this->d = this_00;
  QCollatorPrivate::init(this_00,ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCollator::QCollator()
    : d(new QCollatorPrivate(QLocale().collation()))
{
    d->init();
}